

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O1

DdNode * extraBddSpaceCanonVars(DdManager *dd,DdNode *bF)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *pDVar3;
  DdNode *bF_00;
  DdNode *pDVar4;
  
  pDVar4 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  if (pDVar4->index == 0x7fffffff) {
    return bF;
  }
  pDVar2 = cuddCacheLookup1(dd,extraBddSpaceCanonVars,bF);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = (pDVar4->type).kids.E;
  if (pDVar4 == bF) {
    bF_00 = (pDVar4->type).kids.T;
  }
  else {
    pDVar2 = (DdNode *)((ulong)pDVar2 ^ 1);
    bF_00 = (DdNode *)((ulong)(pDVar4->type).kids.T ^ 1);
  }
  pDVar3 = (DdNode *)((ulong)dd->one ^ 1);
  if (pDVar2 == pDVar3) {
    pDVar2 = extraBddSpaceCanonVars(dd,bF_00);
  }
  else {
    T = extraBddSpaceCanonVars(dd,pDVar2);
    pDVar2 = T;
    if (bF_00 != pDVar3) {
      if (T == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar2 = cuddUniqueInter(dd,pDVar4->index,T,(DdNode *)((ulong)dd->one ^ 1));
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,T);
        return (DdNode *)0x0;
      }
      piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      goto LAB_007aa198;
    }
  }
  if (pDVar2 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
LAB_007aa198:
  cuddCacheInsert1(dd,extraBddSpaceCanonVars,bF,pDVar2);
  return pDVar2;
}

Assistant:

DdNode * extraBddSpaceCanonVars( DdManager * dd, DdNode * bF )
{
	DdNode * bRes, * bFR;
	statLine( dd );

	bFR = Cudd_Regular(bF);
	if ( cuddIsConstant(bFR) )
		return bF;

    if ( (bRes = cuddCacheLookup1(dd, extraBddSpaceCanonVars, bF)) )
    	return bRes;
	else
	{
		DdNode * bF0,  * bF1;
		DdNode * bRes, * bRes0; 

		if ( bFR != bF ) // bF is complemented 
		{
			bF0 = Cudd_Not( cuddE(bFR) );
			bF1 = Cudd_Not( cuddT(bFR) );
		}
		else
		{
			bF0 = cuddE(bFR);
			bF1 = cuddT(bFR);
		}

		if ( bF0 == b0 )
		{
			bRes = extraBddSpaceCanonVars( dd, bF1 );
			if ( bRes == NULL )
				return NULL;
		}
		else if ( bF1 == b0 )
		{
			bRes = extraBddSpaceCanonVars( dd, bF0 );
			if ( bRes == NULL )
				return NULL;
		}
		else
		{
			bRes0 = extraBddSpaceCanonVars( dd, bF0 );
			if ( bRes0 == NULL )
				return NULL;
			cuddRef( bRes0 );

			bRes = cuddUniqueInter( dd, bFR->index, bRes0, b0 );
			if ( bRes == NULL ) 
			{
				Cudd_RecursiveDeref( dd,bRes0 );
				return NULL;
			}
			cuddDeref( bRes0 );
		}

		cuddCacheInsert1( dd, extraBddSpaceCanonVars, bF, bRes );
		return bRes;
	}
}